

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O0

void __thiscall
v_array<COST_SENSITIVE::label>::resize(v_array<COST_SENSITIVE::label> *this,size_t length)

{
  ostream *poVar1;
  undefined8 uVar2;
  ulong in_RSI;
  string *in_RDI;
  stringstream __msg;
  label *temp;
  size_t old_len;
  undefined4 in_stack_fffffffffffffe24;
  int plineNumber;
  char *in_stack_fffffffffffffe28;
  vw_exception *in_stack_fffffffffffffe30;
  stringstream local_1a8 [16];
  ostream local_198;
  void *local_20;
  ulong local_18;
  ulong local_10;
  
  if ((long)((in_RDI->field_2)._M_allocated_capacity - *(long *)in_RDI) >> 5 != in_RSI) {
    local_18 = (long)(in_RDI->_M_string_length - *(long *)in_RDI) >> 5;
    local_10 = in_RSI;
    local_20 = realloc(*(void **)in_RDI,in_RSI << 5);
    if ((local_20 == (void *)0x0) && ((local_10 & 0x7ffffffffffffff) != 0)) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      poVar1 = std::operator<<(&local_198,"realloc of ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
      std::operator<<(poVar1," failed in resize().  out of memory?");
      plineNumber = CONCAT13(1,(int3)in_stack_fffffffffffffe24);
      uVar2 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,plineNumber,in_RDI);
      __cxa_throw(uVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    *(void **)in_RDI = local_20;
    if ((local_18 < local_10) && (*(long *)in_RDI + local_18 * 0x20 != 0)) {
      memset((void *)(*(long *)in_RDI + local_18 * 0x20),0,(local_10 - local_18) * 0x20);
    }
    in_RDI->_M_string_length = *(long *)in_RDI + local_18 * 0x20;
    (in_RDI->field_2)._M_allocated_capacity = *(long *)in_RDI + local_10 * 0x20;
  }
  return;
}

Assistant:

void resize(size_t length)
  {
    if ((size_t)(end_array - _begin) != length)
    {
      size_t old_len = _end - _begin;
      T* temp = (T*)realloc(_begin, sizeof(T) * length);
      if ((temp == nullptr) && ((sizeof(T) * length) > 0))
      {
        THROW("realloc of " << length << " failed in resize().  out of memory?");
      }
      else
        _begin = temp;
      if (old_len < length && _begin + old_len != nullptr)
        memset(_begin + old_len, 0, (length - old_len) * sizeof(T));
      _end = _begin + old_len;
      end_array = _begin + length;
    }
  }